

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

IGUIFileOpenDialog * __thiscall
irr::gui::CGUIEnvironment::addFileOpenDialog
          (CGUIEnvironment *this,wchar_t *title,bool modal,IGUIElement *parent,s32 id,
          bool restoreCWD,char_type *startDir)

{
  int *piVar1;
  long lVar2;
  CGUIFileOpenDialog *this_00;
  undefined7 in_register_00000011;
  IGUIElement *parent_00;
  
  if ((int)CONCAT71(in_register_00000011,modal) == 0) {
    parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
    if (parent != (IGUIElement *)0x0) {
      parent_00 = parent;
    }
    this_00 = (CGUIFileOpenDialog *)operator_new(0x280);
    CGUIFileOpenDialog::CGUIFileOpenDialog
              (this_00,title,&this->super_IGUIEnvironment,parent_00,id,restoreCWD,startDir);
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
    piVar1 = (int *)(&this_00->field_0x10 + lVar2);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
    }
  }
  else {
    this_00 = (CGUIFileOpenDialog *)0x0;
  }
  return (IGUIFileOpenDialog *)this_00;
}

Assistant:

IGUIFileOpenDialog *CGUIEnvironment::addFileOpenDialog(const wchar_t *title,
		bool modal, IGUIElement *parent, s32 id,
		bool restoreCWD, io::path::char_type *startDir)
{
	parent = parent ? parent : this;

	if (modal)
		return nullptr;

	IGUIFileOpenDialog *d = new CGUIFileOpenDialog(title, this, parent, id,
			restoreCWD, startDir);
	d->drop();

	return d;
}